

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall IR::Temp::~Temp(Temp *this)

{
  Temp *this_local;
  
  ~Temp(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

const std::string& type() const {
    static std::string kDefaultType{"unsigned"};
    const std::string& ty = std::get<0>(*this);
    return !ty.empty() ? ty : kDefaultType;
  }